

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

ncnn_datareader_t ncnn_datareader_create_from_stdio(FILE *fp)

{
  ncnn_datareader_t _dr;
  DataReaderFromStdio_c_api *this;
  
  _dr = (ncnn_datareader_t)malloc(0x18);
  this = (DataReaderFromStdio_c_api *)operator_new(0x18);
  DataReaderFromStdio_c_api::DataReaderFromStdio_c_api(this,fp,_dr);
  _dr->pthis = this;
  _dr->scan = __ncnn_DataReaderFromStdio_scan;
  _dr->read = __ncnn_DataReaderFromStdio_read;
  return _dr;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create_from_stdio(FILE* fp)
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReaderFromStdio_c_api(fp, dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReaderFromStdio_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReaderFromStdio_read;
    return dr;
}